

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_beziers.cpp
# Opt level: O0

Bezier<2UL> * bezier::test::defaultQuadraticBezier(void)

{
  initializer_list<bezier::Vec2> __l;
  Bezier<2UL> *in_RDI;
  allocator<bezier::Vec2> local_61;
  Vec2 local_60;
  Vec2 local_50;
  Vec2 local_40;
  Vec2 *local_30;
  size_type local_28;
  vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> local_20;
  
  Vec2::Vec2(&local_60,70.0,155.0);
  Vec2::Vec2(&local_50,20.0,110.0);
  Vec2::Vec2(&local_40,100.0,75.0);
  local_28 = 3;
  local_30 = &local_60;
  std::allocator<bezier::Vec2>::allocator(&local_61);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::vector(&local_20,__l,&local_61);
  Bezier<2UL>::Bezier(in_RDI,&local_20);
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::~vector(&local_20);
  std::allocator<bezier::Vec2>::~allocator(&local_61);
  return in_RDI;
}

Assistant:

bezier::Bezier<2> bezier::test::defaultQuadraticBezier()
{
    return ::bezier::Bezier<2>({
        {70, 155},
        {20, 110},
        {100, 75}
    });
}